

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O1

void __thiscall cilkred_map::rehash(cilkred_map *this,__cilkrts_worker *w)

{
  size_t sVar1;
  size_t nbuckets;
  bucket **buckets;
  void *key;
  size_t sVar2;
  bucket *pbVar3;
  
  if ((w == (__cilkrts_worker *)0x0 && this->g == (global_state_t *)0x0) || (w->g == this->g)) {
    sVar1 = this->nelem;
    nbuckets = this->nbuckets;
    buckets = this->buckets;
    make_buckets(this,w,nbuckets * 2);
    if (nbuckets != 0) {
      sVar2 = 0;
      do {
        pbVar3 = buckets[sVar2];
        if ((pbVar3 != (bucket *)0x0) && (key = pbVar3->el[0].key, key != (void *)0x0)) {
          pbVar3 = pbVar3 + 1;
          do {
            insert_no_rehash(this,w,key,pbVar3[-1].el[0].hb,pbVar3[-1].el[0].view);
            key = (void *)pbVar3->nmax;
            pbVar3 = (bucket *)&pbVar3->el[0].view;
          } while (key != (void *)0x0);
        }
        sVar2 = sVar2 + 1;
      } while (sVar2 != nbuckets);
    }
    if (this->nelem == sVar1) {
      free_buckets(w,buckets,nbuckets);
      return;
    }
    rehash();
  }
  rehash();
}

Assistant:

void cilkred_map::rehash(__cilkrts_worker *w)
{
#if REDPAR_DEBUG >= 1
    fprintf(stderr, "[W=%d, desc=rehash, this_map=%p, g=%p, w->g=%p]\n",
	    w->self, this, g, w->g);
    verify_current_wkr(w);
#endif
    CILK_ASSERT((w == 0 && g == 0) || w->g == g);
    
    size_t onbuckets = nbuckets;
    size_t onelem = nelem;
    bucket **obuckets = buckets;
    size_t i;
    bucket *b;

    make_buckets(w, nextsz(nbuckets));
     
    for (i = 0; i < onbuckets; ++i) {
        b = obuckets[i];
        if (b) {
            elem *oel;
            for (oel = b->el; oel->key; ++oel)
                insert_no_rehash(w, oel->key, oel->hb, oel->view);
        }
    }

    CILK_ASSERT(nelem == onelem);

    free_buckets(w, obuckets, onbuckets);
}